

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
person::msgpack_pack<msgpack::v1::packer<msgpack::v1::sbuffer>>
          (person *this,packer<msgpack::v1::sbuffer> *msgpack_pk)

{
  char d;
  undefined1 local_29;
  tuple<const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  local_28;
  
  local_28.
  super__Tuple_impl<0UL,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  .
  super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  .
  super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl = &this->name;
  local_28.
  super__Tuple_impl<0UL,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  .
  super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  .super__Tuple_impl<2UL,_const_int_&>.super__Head_base<2UL,_const_int_&,_false>._M_head_impl =
       (_Head_base<2UL,_const_int_&,_false>)&this->age;
  local_29 = 0x93;
  local_28.
  super__Tuple_impl<0UL,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  .super__Head_base<0UL,_const_int_&,_false>._M_head_impl = &this->id;
  msgpack::v1::sbuffer::write
            (msgpack_pk->m_stream,(int)&local_29,(void *)0x1,
             (size_t)local_28.
                     super__Tuple_impl<0UL,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
                     .
                     super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
                     .super__Tuple_impl<2UL,_const_int_&>.super__Head_base<2UL,_const_int_&,_false>.
                     _M_head_impl);
  msgpack::v1::type::
  define_array_imp<std::tuple<int_const&,std::__cxx11::string_const&,int_const&>,3ul>::
  pack<msgpack::v1::packer<msgpack::v1::sbuffer>>(msgpack_pk,&local_28);
  return;
}

Assistant:

void test_get_person_name() {
  try {
    rpc_client client("127.0.0.1", 9000);
    bool r = client.connect();
    if (!r) {
      std::cout << "connect timeout" << std::endl;
      return;
    }

    auto result =
        client.call<std::string>("get_person_name", person{1, "tom", 20});
    std::cout << result << std::endl;
  } catch (const std::exception &e) {
    std::cout << e.what() << std::endl;
  }
}